

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Picture.cpp
# Opt level: O2

Color * __thiscall Picture::getColor(Color *__return_storage_ptr__,Picture *this,double x,double y)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  Color *pCVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  ushort local_a4;
  byte local_a2;
  Color *local_a0;
  ulong local_98;
  ulong local_90;
  Vector3 local_88;
  double local_68;
  double dStack_60;
  undefined1 local_58 [16];
  Vector3 local_48;
  
  dVar13 = 0.0;
  if (0.0 <= x) {
    dVar13 = x;
  }
  dStack_60 = 1.0;
  if (dVar13 <= 1.0) {
    dStack_60 = dVar13;
  }
  dVar13 = 0.0;
  if (0.0 <= y) {
    dVar13 = y;
  }
  dVar10 = 1.0;
  if (dVar13 <= 1.0) {
    dVar10 = dVar13;
  }
  uVar1 = this->rows;
  uVar2 = this->cols;
  local_68 = (double)(uVar1 + -1) * (1.0 - dVar10);
  dStack_60 = (double)(uVar2 + -1) * dStack_60;
  local_98 = (ulong)(uint)(int)local_68;
  iVar8 = (int)dStack_60;
  local_48.x = 0.0;
  local_48.y = 0.0;
  local_48.z = 0.0;
  uVar6 = 0;
  local_a0 = __return_storage_ptr__;
  while (pCVar5 = local_a0, (int)uVar6 != 2) {
    local_58 = ZEXT416((uint)((int)local_98 + (int)uVar6));
    local_90 = uVar6;
    for (iVar7 = 0; iVar7 != 2; iVar7 = iVar7 + 1) {
      uVar6._0_4_ = this->rows;
      uVar6._4_4_ = this->cols;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar6;
      auVar11._4_4_ = iVar8 + iVar7;
      auVar11._0_4_ = local_58._0_4_;
      auVar11._8_4_ = local_58._8_4_;
      auVar11._12_4_ = local_58._12_4_;
      auVar12._0_4_ = -(uint)((int)(undefined4)uVar6 < (int)local_58._0_4_);
      auVar12._4_4_ = -(uint)((int)uVar6._4_4_ < iVar8 + iVar7);
      auVar12._8_4_ = -(uint)(0 < (int)local_58._8_4_);
      auVar12._12_4_ = -(uint)(0 < (int)local_58._12_4_);
      auVar9 = ~auVar12 & auVar11 | auVar9 & auVar12;
      iVar3 = auVar9._0_4_;
      iVar4 = auVar9._4_4_;
      cv::Vec<unsigned_char,_3>::Vec<double>
                ((Vec<unsigned_char,_3> *)
                 ((1.0 - ABS(dStack_60 - (double)iVar4)) * (1.0 - ABS(local_68 - (double)iVar3))),
                 &local_a4,this->data + (long)(uVar6._4_4_ * iVar3) + (long)iVar4,&local_88);
      local_88.x = (double)(local_a4 & 0xff);
      local_88.y = (double)(byte)(local_a4 >> 8);
      local_88.z = (double)local_a2;
      operator+=(&local_48,&local_88);
    }
    uVar6 = (ulong)((int)local_90 + 1);
  }
  local_88.x = 255.0;
  operator/(&local_48,&local_88.x);
  return pCVar5;
}

Assistant:

Color Picture::getColor(double x, double y) const
{
    x = min(max(x, 0.), 1.);
    y = min(max(y, 0.), 1.);
    y = (1 - y) * (rows - 1);
    x = x * (cols - 1);
    Color res;
    for (int i = 0; i < 2; ++i)
        for (int j = 0; j < 2; ++j) {
            int ny = std::min(int(y) + i, this->rows);
            int nx = std::min(int(x) + j, this->cols);
            res += (1 - fabs(y - ny)) * (1 - fabs(x - nx)) * (*this)[ny][nx];
        }
    return res / 255;
}